

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O2

bool QFileSystemEngine::setFileTime(int fd,QDateTime *newDate,FileTime time,QSystemError *error)

{
  bool bVar1;
  int iVar2;
  qint64 qVar3;
  uint *puVar4;
  long in_FS_OFFSET;
  timespec ts [2];
  timespec local_58;
  undefined8 local_48;
  undefined8 local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QDateTime::isValid(newDate);
  if (time - FileModificationTime < 0xfffffffe && bVar1) {
    local_58.tv_sec = 0;
    local_58.tv_nsec = 0x3ffffffe;
    local_48 = 0;
    local_40 = 0x3ffffffe;
    if ((time == FileModificationTime) || (time == FileAccessTime)) {
      qVar3 = QDateTime::toMSecsSinceEpoch(newDate);
      (&local_58)[time != FileAccessTime].tv_sec = qVar3 / 1000;
      (&local_58)[time != FileAccessTime].tv_nsec = (qVar3 / 1000) * -1000000000 + qVar3 * 1000000;
    }
    iVar2 = futimens(fd,&local_58);
    bVar1 = iVar2 != -1;
    if (!bVar1) {
      puVar4 = (uint *)__errno_location();
      *error = (QSystemError)((ulong)*puVar4 | 0x100000000);
    }
  }
  else {
    error->errorCode = 0x16;
    error->errorScope = StandardLibraryError;
    bVar1 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileSystemEngine::setFileTime(int fd, const QDateTime &newDate, QFile::FileTime time, QSystemError &error)
{
    if (!newDate.isValid()
        || time == QFile::FileBirthTime || time == QFile::FileMetadataChangeTime) {
        error = QSystemError(EINVAL, QSystemError::StandardLibraryError);
        return false;
    }

#if QT_CONFIG(futimens)
    // UTIME_OMIT: leave file timestamp unchanged
    struct timespec ts[2] = {{0, UTIME_OMIT}, {0, UTIME_OMIT}};

    if (time == QFile::FileAccessTime || time == QFile::FileModificationTime) {
        const int idx = time == QFile::FileAccessTime ? 0 : 1;
        const std::chrono::milliseconds msecs{newDate.toMSecsSinceEpoch()};
        ts[idx] = durationToTimespec(msecs);
    }

    if (futimens(fd, ts) == -1) {
        error = QSystemError(errno, QSystemError::StandardLibraryError);
        return false;
    }

    return true;
#else
    Q_UNUSED(fd);
    error = QSystemError(ENOSYS, QSystemError::StandardLibraryError);
    return false;
#endif
}